

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANMS.cpp
# Opt level: O0

void ANMS(Mat *cNorm,vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *corners,int threshold)

{
  float *pfVar1;
  Point_<int> local_80;
  Point2f local_78;
  KeyPoint local_70;
  float local_44;
  int local_40;
  float response;
  int j;
  int i;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> keyPoint;
  int threshold_local;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *corners_local;
  Mat *cNorm_local;
  
  keyPoint.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = threshold;
  std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::vector
            ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)&j);
  for (response = 0.0; (int)response < *(int *)(cNorm + 8); response = (float)((int)response + 1)) {
    for (local_40 = 0; local_40 < *(int *)(cNorm + 0xc); local_40 = local_40 + 1) {
      pfVar1 = cv::Mat::at<float>(cNorm,(int)response,local_40);
      local_44 = *pfVar1;
      if ((float)keyPoint.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ < local_44) {
        cv::Point_<int>::Point_(&local_80,local_40,(int)response);
        cv::Point_::operator_cast_to_Point_((Point_ *)&local_78);
        cv::KeyPoint::KeyPoint(&local_70,&local_78,3.0,-1.0,local_44,0,-1);
        std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::push_back
                  ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)&j,&local_70);
      }
    }
  }
  ANMS((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)&j,corners);
  std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::~vector
            ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)&j);
  return;
}

Assistant:

void ANMS(const cv::Mat& cNorm, std::vector<KeyPoint>& corners, int threshold) {

	vector<KeyPoint> keyPoint;

	for (int i = 0; i < cNorm.rows; ++i) {
		for (int j = 0; j < cNorm.cols; ++j) {
			float response = cNorm.at<float>(i, j);
			if (response <= threshold) continue;
			keyPoint.push_back(KeyPoint(Point(j, i), 3, -1.0F, response));
		}
	}

	ANMS(keyPoint, corners);
}